

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O0

void __thiscall Finger::stabilize(Finger *this,Filter *f)

{
  reference pvVar1;
  undefined1 local_30 [8];
  vector<float,_std::allocator<float>_> prd;
  Filter *f_local;
  Finger *this_local;
  
  prd.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)f;
  Filter::predict((vector<float,_std::allocator<float>_> *)local_30,f);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_30,0);
  (this->ptStart).x = (int)*pvVar1;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_30,1);
  (this->ptStart).y = (int)*pvVar1;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_30,2);
  (this->ptEnd).x = (int)*pvVar1;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_30,3);
  (this->ptEnd).y = (int)*pvVar1;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_30,4);
  (this->ptFar).x = (int)*pvVar1;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_30,5);
  (this->ptFar).y = (int)*pvVar1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return;
}

Assistant:

void Finger::stabilize(Filter &f) {
    vector<float> prd = f.predict();
    ptStart.x = prd[0];
    ptStart.y = prd[1];
    ptEnd.x = prd[2];
    ptEnd.y = prd[3];
    ptFar.x = prd[4];
    ptFar.y = prd[5];
}